

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.cc
# Opt level: O0

void __thiscall draco::GeometryAttribute::GeometryAttribute(GeometryAttribute *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  DataBufferDescriptor::DataBufferDescriptor((DataBufferDescriptor *)(in_RDI + 1));
  *(undefined1 *)(in_RDI + 3) = 1;
  *(undefined4 *)((long)in_RDI + 0x1c) = 9;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  return;
}

Assistant:

GeometryAttribute::GeometryAttribute()
    : buffer_(nullptr),
      num_components_(1),
      data_type_(DT_FLOAT32),
      byte_stride_(0),
      byte_offset_(0),
      attribute_type_(INVALID),
      unique_id_(0) {}